

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# batched_buffered_data.cpp
# Opt level: O1

void __thiscall duckdb::BatchedBufferedData::CompleteBatch(BatchedBufferedData *this,idx_t batch)

{
  mutex *__mutex;
  int iVar1;
  _Base_ptr p_Var2;
  _Base_ptr p_Var3;
  _Rb_tree_header *p_Var4;
  
  __mutex = &(this->super_BufferedData).glock;
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar1 == 0) {
    p_Var4 = &(this->buffer)._M_t._M_impl.super__Rb_tree_header;
    p_Var3 = (this->buffer)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var2 = &p_Var4->_M_header;
    for (; p_Var3 != (_Base_ptr)0x0; p_Var3 = (&p_Var3->_M_left)[*(ulong *)(p_Var3 + 1) < batch]) {
      if (*(ulong *)(p_Var3 + 1) >= batch) {
        p_Var2 = p_Var3;
      }
    }
    p_Var3 = &p_Var4->_M_header;
    if (((_Rb_tree_header *)p_Var2 != p_Var4) && (p_Var3 = p_Var2, batch < *(ulong *)(p_Var2 + 1)))
    {
      p_Var3 = &p_Var4->_M_header;
    }
    if ((_Rb_tree_header *)p_Var3 != p_Var4) {
      *(undefined1 *)&p_Var3[3]._M_right = 1;
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    return;
  }
  ::std::__throw_system_error(iVar1);
}

Assistant:

void BatchedBufferedData::CompleteBatch(idx_t batch) {
	lock_guard<mutex> lock(glock);
	auto it = buffer.find(batch);
	if (it == buffer.end()) {
		return;
	}

	auto &in_progress_batch = it->second;
	in_progress_batch.completed = true;
}